

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

void __thiscall efsw::String::String(String *this,char *ansiString,locale *locale)

{
  size_t sVar1;
  back_insert_iterator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  output;
  size_t length;
  locale *locale_local;
  char *ansiString_local;
  String *this_local;
  
  std::__cxx11::u32string::u32string((u32string *)this);
  if ((ansiString != (char *)0x0) && (sVar1 = strlen(ansiString), sVar1 != 0)) {
    std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
    reserve(&this->mString,sVar1 + 1);
    output = std::back_inserter<std::__cxx11::u32string>(&this->mString);
    Utf<32u>::FromAnsi<char_const*,std::back_insert_iterator<std::__cxx11::u32string>>
              (ansiString,ansiString + sVar1,output,locale);
  }
  return;
}

Assistant:

String::String( const char* ansiString, const std::locale& locale ) {
	if ( ansiString ) {
		std::size_t length = strlen( ansiString );
		if ( length > 0 ) {
			mString.reserve( length + 1 );
			Utf32::FromAnsi( ansiString, ansiString + length, std::back_inserter( mString ),
							 locale );
		}
	}
}